

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O1

UnicodeString *
icu_63::DateTimePatternGenerator::staticGetSkeleton
          (UnicodeString *__return_storage_ptr__,UnicodeString *pattern,UErrorCode *param_2)

{
  long lVar1;
  PtnSkeleton localSkeleton;
  DateTimeMatcher matcher;
  FormatParser fp;
  PtnSkeleton local_dc8;
  DateTimeMatcher local_d38;
  FormatParser local_ca0;
  
  local_ca0._vptr_FormatParser = (_func_int **)&PTR__FormatParser_0047d820;
  lVar1 = 0x10;
  do {
    *(undefined ***)((long)(&local_d38.skeleton.baseOriginal + 1) + lVar1) =
         &PTR__UnicodeString_0048be70;
    *(undefined2 *)((long)&local_ca0._vptr_FormatParser + lVar1) = 2;
    lVar1 = lVar1 + 0x40;
  } while (lVar1 != 0xc90);
  local_ca0.itemNumber = 0;
  local_ca0.status = START;
  local_d38._vptr_DateTimeMatcher = (_func_int **)&PTR__DateTimeMatcher_0047d800;
  local_d38.skeleton._vptr_PtnSkeleton = (_func_int **)&PTR__PtnSkeleton_0047d868;
  local_d38.skeleton.original.chars[0] = '\0';
  local_d38.skeleton.original.chars[1] = '\0';
  local_d38.skeleton.original.chars[2] = '\0';
  local_d38.skeleton.original.chars[3] = '\0';
  local_d38.skeleton.original.chars[4] = '\0';
  local_d38.skeleton.original.chars[5] = '\0';
  local_d38.skeleton.original.chars[6] = '\0';
  local_d38.skeleton.original.chars[7] = '\0';
  local_d38.skeleton.original.chars[8] = '\0';
  local_d38.skeleton.original.chars[9] = '\0';
  local_d38.skeleton.original.chars[10] = '\0';
  local_d38.skeleton.original.chars[0xb] = '\0';
  local_d38.skeleton.original.chars[0xc] = '\0';
  local_d38.skeleton.original.chars[0xd] = '\0';
  local_d38.skeleton.original.chars[0xe] = '\0';
  local_d38.skeleton.original.chars[0xf] = '\0';
  local_d38.skeleton.original.lengths[0] = '\0';
  local_d38.skeleton.original.lengths[1] = '\0';
  local_d38.skeleton.original.lengths[2] = '\0';
  local_d38.skeleton.original.lengths[3] = '\0';
  local_d38.skeleton.original.lengths[4] = '\0';
  local_d38.skeleton.original.lengths[5] = '\0';
  local_d38.skeleton.original.lengths[6] = '\0';
  local_d38.skeleton.original.lengths[7] = '\0';
  local_d38.skeleton.original.lengths[8] = '\0';
  local_d38.skeleton.original.lengths[9] = '\0';
  local_d38.skeleton.original.lengths[10] = '\0';
  local_d38.skeleton.original.lengths[0xb] = '\0';
  local_d38.skeleton.original.lengths[0xc] = '\0';
  local_d38.skeleton.original.lengths[0xd] = '\0';
  local_d38.skeleton.original.lengths[0xe] = '\0';
  local_d38.skeleton.original.lengths[0xf] = '\0';
  local_d38.skeleton.baseOriginal.chars[0] = '\0';
  local_d38.skeleton.baseOriginal.chars[1] = '\0';
  local_d38.skeleton.baseOriginal.chars[2] = '\0';
  local_d38.skeleton.baseOriginal.chars[3] = '\0';
  local_d38.skeleton.baseOriginal.chars[4] = '\0';
  local_d38.skeleton.baseOriginal.chars[5] = '\0';
  local_d38.skeleton.baseOriginal.chars[6] = '\0';
  local_d38.skeleton.baseOriginal.chars[7] = '\0';
  local_d38.skeleton.baseOriginal.chars[8] = '\0';
  local_d38.skeleton.baseOriginal.chars[9] = '\0';
  local_d38.skeleton.baseOriginal.chars[10] = '\0';
  local_d38.skeleton.baseOriginal.chars[0xb] = '\0';
  local_d38.skeleton.baseOriginal.chars[0xc] = '\0';
  local_d38.skeleton.baseOriginal.chars[0xd] = '\0';
  local_d38.skeleton.baseOriginal.chars[0xe] = '\0';
  local_d38.skeleton.baseOriginal.chars[0xf] = '\0';
  local_d38.skeleton.baseOriginal.lengths[0] = '\0';
  local_d38.skeleton.baseOriginal.lengths[1] = '\0';
  local_d38.skeleton.baseOriginal.lengths[2] = '\0';
  local_d38.skeleton.baseOriginal.lengths[3] = '\0';
  local_d38.skeleton.baseOriginal.lengths[4] = '\0';
  local_d38.skeleton.baseOriginal.lengths[5] = '\0';
  local_d38.skeleton.baseOriginal.lengths[6] = '\0';
  local_d38.skeleton.baseOriginal.lengths[7] = '\0';
  local_d38.skeleton.baseOriginal.lengths[8] = '\0';
  local_d38.skeleton.baseOriginal.lengths[9] = '\0';
  local_d38.skeleton.baseOriginal.lengths[10] = '\0';
  local_d38.skeleton.baseOriginal.lengths[0xb] = '\0';
  local_d38.skeleton.baseOriginal.lengths[0xc] = '\0';
  local_d38.skeleton.baseOriginal.lengths[0xd] = '\0';
  local_d38.skeleton.baseOriginal.lengths[0xe] = '\0';
  local_d38.skeleton.baseOriginal.lengths[0xf] = '\0';
  local_dc8._vptr_PtnSkeleton = (_func_int **)&PTR__PtnSkeleton_0047d868;
  local_dc8.original.chars[0] = '\0';
  local_dc8.original.chars[1] = '\0';
  local_dc8.original.chars[2] = '\0';
  local_dc8.original.chars[3] = '\0';
  local_dc8.original.chars[4] = '\0';
  local_dc8.original.chars[5] = '\0';
  local_dc8.original.chars[6] = '\0';
  local_dc8.original.chars[7] = '\0';
  local_dc8.original.chars[8] = '\0';
  local_dc8.original.chars[9] = '\0';
  local_dc8.original.chars[10] = '\0';
  local_dc8.original.chars[0xb] = '\0';
  local_dc8.original.chars[0xc] = '\0';
  local_dc8.original.chars[0xd] = '\0';
  local_dc8.original.chars[0xe] = '\0';
  local_dc8.original.chars[0xf] = '\0';
  local_dc8.original.lengths[0] = '\0';
  local_dc8.original.lengths[1] = '\0';
  local_dc8.original.lengths[2] = '\0';
  local_dc8.original.lengths[3] = '\0';
  local_dc8.original.lengths[4] = '\0';
  local_dc8.original.lengths[5] = '\0';
  local_dc8.original.lengths[6] = '\0';
  local_dc8.original.lengths[7] = '\0';
  local_dc8.original.lengths[8] = '\0';
  local_dc8.original.lengths[9] = '\0';
  local_dc8.original.lengths[10] = '\0';
  local_dc8.original.lengths[0xb] = '\0';
  local_dc8.original.lengths[0xc] = '\0';
  local_dc8.original.lengths[0xd] = '\0';
  local_dc8.original.lengths[0xe] = '\0';
  local_dc8.original.lengths[0xf] = '\0';
  local_dc8.baseOriginal.chars[0] = '\0';
  local_dc8.baseOriginal.chars[1] = '\0';
  local_dc8.baseOriginal.chars[2] = '\0';
  local_dc8.baseOriginal.chars[3] = '\0';
  local_dc8.baseOriginal.chars[4] = '\0';
  local_dc8.baseOriginal.chars[5] = '\0';
  local_dc8.baseOriginal.chars[6] = '\0';
  local_dc8.baseOriginal.chars[7] = '\0';
  local_dc8.baseOriginal.chars[8] = '\0';
  local_dc8.baseOriginal.chars[9] = '\0';
  local_dc8.baseOriginal.chars[10] = '\0';
  local_dc8.baseOriginal.chars[0xb] = '\0';
  local_dc8.baseOriginal.chars[0xc] = '\0';
  local_dc8.baseOriginal.chars[0xd] = '\0';
  local_dc8.baseOriginal.chars[0xe] = '\0';
  local_dc8.baseOriginal.chars[0xf] = '\0';
  local_dc8.baseOriginal.lengths[0] = '\0';
  local_dc8.baseOriginal.lengths[1] = '\0';
  local_dc8.baseOriginal.lengths[2] = '\0';
  local_dc8.baseOriginal.lengths[3] = '\0';
  local_dc8.baseOriginal.lengths[4] = '\0';
  local_dc8.baseOriginal.lengths[5] = '\0';
  local_dc8.baseOriginal.lengths[6] = '\0';
  local_dc8.baseOriginal.lengths[7] = '\0';
  local_dc8.baseOriginal.lengths[8] = '\0';
  local_dc8.baseOriginal.lengths[9] = '\0';
  local_dc8.baseOriginal.lengths[10] = '\0';
  local_dc8.baseOriginal.lengths[0xb] = '\0';
  local_dc8.baseOriginal.lengths[0xc] = '\0';
  local_dc8.baseOriginal.lengths[0xd] = '\0';
  local_dc8.baseOriginal.lengths[0xe] = '\0';
  local_dc8.baseOriginal.lengths[0xf] = '\0';
  DateTimeMatcher::set(&local_d38,pattern,&local_ca0,&local_dc8);
  PtnSkeleton::getSkeleton(__return_storage_ptr__,&local_dc8);
  local_ca0._vptr_FormatParser = (_func_int **)&PTR__FormatParser_0047d820;
  lVar1 = 0xc48;
  do {
    icu_63::UnicodeString::~UnicodeString
              ((UnicodeString *)((long)&local_ca0._vptr_FormatParser + lVar1));
    lVar1 = lVar1 + -0x40;
  } while (lVar1 != -0x38);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
DateTimePatternGenerator::staticGetSkeleton(
        const UnicodeString& pattern, UErrorCode& /*status*/) {
    FormatParser fp;
    DateTimeMatcher matcher;
    PtnSkeleton localSkeleton;
    matcher.set(pattern, &fp, localSkeleton);
    return localSkeleton.getSkeleton();
}